

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall FlowGraph::FindLoops(FlowGraph *this)

{
  FlowGraph *pFVar1;
  BasicBlock *tailBlock;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  BasicBlock *headBlock;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Type *ppFVar6;
  LabelInstr *pLVar7;
  BasicBlock **ppBVar8;
  Iterator local_40;
  
  if (this->hasLoop == true) {
    pFVar1 = this->func->m_fg;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    ppBVar8 = &pFVar1->tailBlock;
    while (tailBlock = *ppBVar8, tailBlock != (BasicBlock *)0x0) {
      if (((tailBlock->field_0x18 & 1) == 0) && (tailBlock->loop == (Loop *)0x0)) {
        local_40.list =
             &(tailBlock->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
        local_40.current = &(local_40.list)->super_SListNodeBase<Memory::ArenaAllocator>;
        while( true ) {
          if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
              (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar4) goto LAB_003f8697;
            *puVar5 = 0;
          }
          pSVar2 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                   (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                    &(local_40.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          if (pSVar2 == local_40.list) break;
          local_40.current = (NodeBase *)pSVar2;
          ppFVar6 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                              (&local_40);
          headBlock = (*ppFVar6)->succBlock;
          if (headBlock == (BasicBlock *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0x4dd,"(succ)","succ");
            if (!bVar4) {
LAB_003f8697:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar5 = 0;
          }
          if (((headBlock->field_0x18 & 4) != 0) && (headBlock->loop == (Loop *)0x0)) {
            BuildLoop(this,headBlock,tailBlock,(Loop *)0x0);
          }
        }
        if (((*(ushort *)&tailBlock->field_0x18 & 4) != 0) && (tailBlock->loop == (Loop *)0x0)) {
          *(ushort *)&tailBlock->field_0x18 = *(ushort *)&tailBlock->field_0x18 & 0xfffb;
          pLVar7 = IR::Instr::AsLabelInstr(tailBlock->firstInstr);
          pLVar7->field_0x78 = pLVar7->field_0x78 & 0xfe;
        }
      }
      ppBVar8 = &tailBlock->prev;
    }
  }
  return;
}

Assistant:

void
FlowGraph::FindLoops()
{
    if (!this->hasLoop)
    {
        return;
    }

    Func * func = this->func;

    FOREACH_BLOCK_BACKWARD_IN_FUNC(block, func)
    {
        if (block->loop != nullptr)
        {
            // Block already visited
            continue;
        }
        FOREACH_SUCCESSOR_BLOCK(succ, block)
        {
            if (succ->isLoopHeader && succ->loop == nullptr)
            {
                // Found a loop back-edge
                BuildLoop(succ, block);
            }
        } NEXT_SUCCESSOR_BLOCK;
        if (block->isLoopHeader && block->loop == nullptr)
        {
            // We would have built a loop for it if it was a loop...
            block->isLoopHeader = false;
            block->GetFirstInstr()->AsLabelInstr()->m_isLoopTop = false;
        }
    } NEXT_BLOCK_BACKWARD_IN_FUNC;
}